

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_array_2_d.cxx
# Opt level: O3

void __thiscall BooleanArray2D::set(BooleanArray2D *this,uint row,uint col,bool value)

{
  byte bVar1;
  out_of_range *this_00;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  
  if (row < this->rows) {
    if (col < this->cols) {
      uVar2 = this->cols * row + col;
      uVar3 = uVar2 >> 3;
      bVar1 = this->data[uVar3];
      bVar5 = (byte)(1 << ((byte)uVar2 & 7));
      bVar4 = ~bVar5 & bVar1;
      if (value) {
        bVar4 = bVar1 | bVar5;
      }
      this->data[uVar3] = bVar4;
      return;
    }
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Column out of range.");
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Row out of range.");
  }
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void BooleanArray2D::set(unsigned int row, unsigned int col, bool value)
{
    if(row >= rows) {
        throw std::out_of_range("Row out of range.");
    }
    if(col >= cols) {
        throw std::out_of_range("Column out of range.");
    }

    unsigned int index = row * cols + col;
    unsigned int byte_index = index / 8;
    unsigned int bit_index = index % 8;
    unsigned char &byte = data[byte_index];
    //set bit with bit_index in byte to 1 if value is true and to 0 if value is false:
    if(value) {
        byte |= 1U << bit_index;
    } else {
        byte &= ~(1U << bit_index);
    }
}